

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void __thiscall
RPCArg::RPCArg(RPCArg *this,string *name,Type type,Fallback *fallback,string *description,
              RPCArgOptions *opts)

{
  long lVar1;
  RPCArgOptions *in_RCX;
  int in_EDX;
  long in_RDI;
  RPCArgOptions *pRVar2;
  char *assertion;
  bool *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_R9;
  std::__cxx11::string::string(in_stack_ffffffffffffffa8,in_R9);
  *(int *)(in_RDI + 0x20) = in_EDX;
  pRVar2 = (RPCArgOptions *)(in_RDI + 0x28);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffff68);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::variant(in_stack_ffffffffffffff68,
            (variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)0x9c17bf);
  std::__cxx11::string::string(in_stack_ffffffffffffffa8,in_R9);
  assertion = (char *)(in_RDI + 0xc0);
  RPCArgOptions::RPCArgOptions(in_RCX,pRVar2);
  uVar3 = in_stack_ffffffffffffffb0 & 0xffffff;
  if (((in_EDX != 1) && (uVar3 = in_stack_ffffffffffffffb0 & 0xffffff, in_EDX != 0)) &&
     (uVar3 = in_stack_ffffffffffffffb0 & 0xffffff, in_EDX != 5)) {
    uVar3 = CONCAT13(in_EDX != 6,(int3)in_stack_ffffffffffffffb0);
  }
  inline_check_non_fatal<bool>
            (in_R8,(char *)file,in_stack_ffffffffffffffbc,
             (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),assertion);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCArg(
        std::string name,
        Type type,
        Fallback fallback,
        std::string description,
        RPCArgOptions opts = {})
        : m_names{std::move(name)},
          m_type{std::move(type)},
          m_fallback{std::move(fallback)},
          m_description{std::move(description)},
          m_opts{std::move(opts)}
    {
        CHECK_NONFATAL(type != Type::ARR && type != Type::OBJ && type != Type::OBJ_NAMED_PARAMS && type != Type::OBJ_USER_KEYS);
    }